

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeTest.cpp
# Opt level: O0

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::SafeTest::result(SafeTest *this)

{
  element_type *peVar1;
  long in_RSI;
  exception *e;
  SafeTest *this_local;
  
  peVar1 = std::__shared_ptr_access<const_oout::Test,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_oout::Test,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(in_RSI + 8));
  (*peVar1->_vptr_Test[2])(this);
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         this;
}

Assistant:

unique_ptr<const Result> SafeTest::result() const
{
	try {
		return test->result();
	} catch (const exception &e) {
		return make_unique<const TestResult>(make_shared<ErrorResult>(e.what()));
	}
}